

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::InternalDeallocate<true>
          (RepeatedField<unsigned_int> *this)

{
  int iVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar2;
  HeapRep *pHVar3;
  LogMessageFatal local_20;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x264,"!is_soo()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
  }
  iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  paVar2 = &heap_rep(this)->field_0;
  if (paVar2->arena != (Arena *)0x0) {
    return;
  }
  pHVar3 = heap_rep(this);
  operator_delete(pHVar3,(long)iVar1 * 4 + 8);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }